

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O3

void helicsBrokerDisconnect(HelicsBroker broker,HelicsError *err)

{
  element_type *peVar1;
  BrokerObject *pBVar2;
  
  pBVar2 = helics::getBrokerObject(broker,err);
  if ((pBVar2 != (BrokerObject *)0x0) &&
     (peVar1 = (pBVar2->brokerptr).super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr, peVar1 != (element_type *)0x0)) {
    (*peVar1->_vptr_Broker[3])();
  }
  return;
}

Assistant:

void helicsBrokerDisconnect(HelicsBroker broker, HelicsError* err)
{
    auto* brk = getBroker(broker, err);
    if (brk == nullptr) {
        return;
    }
    try {
        brk->disconnect();
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}